

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

GCObject ** sweeplist(lua_State *L,GCObject **p,lu_mem count)

{
  byte bVar1;
  global_State *pgVar2;
  GCObject *o;
  GCObject *pGVar3;
  int deadmask;
  global_State *g;
  GCObject *curr;
  lu_mem count_local;
  GCObject **p_local;
  lua_State *L_local;
  
  pgVar2 = L->l_G;
  bVar1 = pgVar2->currentwhite;
  curr = (GCObject *)count;
  count_local = (lu_mem)p;
  while( true ) {
    pGVar3 = curr;
    o = *(GCObject **)count_local;
    if (o != (GCObject *)0x0) {
      curr = (GCObject *)((long)curr + -1);
    }
    if (o == (GCObject *)0x0 || pGVar3 == (GCObject *)0x0) break;
    if ((o->gch).tt == '\b') {
      sweeplist(L,&(o->th).openupval,0xfffffffffffffffd);
    }
    if ((byte)(((o->gch).marked ^ 3) & (bVar1 ^ 3)) == 0) {
      *(GCObject **)count_local = (o->gch).next;
      if (o == pgVar2->rootgc) {
        pgVar2->rootgc = (o->gch).next;
      }
      freeobj(L,o);
    }
    else {
      (o->gch).marked = (o->gch).marked & 0xf8 | pgVar2->currentwhite & 3;
      count_local = (lu_mem)o;
    }
  }
  return (GCObject **)count_local;
}

Assistant:

static GCObject**sweeplist(lua_State*L,GCObject**p,lu_mem count){
GCObject*curr;
global_State*g=G(L);
int deadmask=otherwhite(g);
while((curr=*p)!=NULL&&count-->0){
if(curr->gch.tt==8)
sweepwholelist(L,&gco2th(curr)->openupval);
if((curr->gch.marked^bit2mask(0,1))&deadmask){
makewhite(g,curr);
p=&curr->gch.next;
}
else{
*p=curr->gch.next;
if(curr==g->rootgc)
g->rootgc=curr->gch.next;
freeobj(L,curr);
}
}
return p;
}